

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bicubic.h
# Opt level: O0

void ncnn::cubic_coeffs(int w,int outw,int *xofs,float *alpha,int align_corner)

{
  float fVar1;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  double dVar2;
  int sx;
  float fx;
  int dx;
  double scale;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  fVar1 = (float)in_EDI / (float)in_ESI;
  if (in_R8D != 0) {
    fVar1 = (float)(in_EDI + -1) / (float)(in_ESI + -1);
  }
  for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
    local_30 = ((float)local_2c + 0.5) * fVar1 - 0.5;
    if (in_R8D != 0) {
      local_30 = (float)local_2c * fVar1;
    }
    dVar2 = std::floor((double)(ulong)(uint)local_30);
    local_34 = (uint)SUB84(dVar2,0);
    interpolate_cubic(local_30 - (float)(int)local_34,(float *)(in_RCX + (long)(local_2c << 2) * 4))
    ;
    if (0x7fffffff < local_34) {
      local_34 = 1;
      *(float *)(in_RCX + (long)(local_2c << 2) * 4) =
           1.0 - *(float *)(in_RCX + (long)(local_2c * 4 + 3) * 4);
      *(undefined4 *)(in_RCX + (long)(local_2c * 4 + 1) * 4) =
           *(undefined4 *)(in_RCX + (long)(local_2c * 4 + 3) * 4);
      *(undefined4 *)(in_RCX + (long)(local_2c * 4 + 2) * 4) = 0;
      *(undefined4 *)(in_RCX + (long)(local_2c * 4 + 3) * 4) = 0;
    }
    if (local_34 == 0) {
      local_34 = 1;
      *(float *)(in_RCX + (long)(local_2c << 2) * 4) =
           *(float *)(in_RCX + (long)(local_2c << 2) * 4) +
           *(float *)(in_RCX + (long)(local_2c * 4 + 1) * 4);
      *(undefined4 *)(in_RCX + (long)(local_2c * 4 + 1) * 4) =
           *(undefined4 *)(in_RCX + (long)(local_2c * 4 + 2) * 4);
      *(undefined4 *)(in_RCX + (long)(local_2c * 4 + 2) * 4) =
           *(undefined4 *)(in_RCX + (long)(local_2c * 4 + 3) * 4);
      *(undefined4 *)(in_RCX + (long)(local_2c * 4 + 3) * 4) = 0;
    }
    if (local_34 == in_EDI - 2U) {
      local_34 = in_EDI - 3;
      *(float *)(in_RCX + (long)(local_2c * 4 + 3) * 4) =
           *(float *)(in_RCX + (long)(local_2c * 4 + 2) * 4) +
           *(float *)(in_RCX + (long)(local_2c * 4 + 3) * 4);
      *(undefined4 *)(in_RCX + (long)(local_2c * 4 + 2) * 4) =
           *(undefined4 *)(in_RCX + (long)(local_2c * 4 + 1) * 4);
      *(undefined4 *)(in_RCX + (long)(local_2c * 4 + 1) * 4) =
           *(undefined4 *)(in_RCX + (long)(local_2c << 2) * 4);
      *(undefined4 *)(in_RCX + (long)(local_2c << 2) * 4) = 0;
    }
    if (in_EDI + -1 <= (int)local_34) {
      local_34 = in_EDI - 3;
      *(float *)(in_RCX + (long)(local_2c * 4 + 3) * 4) =
           1.0 - *(float *)(in_RCX + (long)(local_2c << 2) * 4);
      *(undefined4 *)(in_RCX + (long)(local_2c * 4 + 2) * 4) =
           *(undefined4 *)(in_RCX + (long)(local_2c << 2) * 4);
      *(undefined4 *)(in_RCX + (long)(local_2c * 4 + 1) * 4) = 0;
      *(undefined4 *)(in_RCX + (long)(local_2c << 2) * 4) = 0;
    }
    *(uint *)(in_RDX + (long)local_2c * 4) = local_34;
  }
  return;
}

Assistant:

static void cubic_coeffs(int w, int outw, int* xofs, float* alpha, int align_corner)
{
    double scale = (double)w / outw;
    if (align_corner)
    {
        scale = (double)(w - 1) / (outw - 1);
    }

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        if (align_corner)
        {
            fx = (float)(dx * scale);
        }

        int sx = static_cast<int>(floor(fx));
        fx -= sx;

        interpolate_cubic(fx, alpha + dx * 4);

        if (sx <= -1)
        {
            sx = 1;
            alpha[dx * 4 + 0] = 1.f - alpha[dx * 4 + 3];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 3];
            alpha[dx * 4 + 2] = 0.f;
            alpha[dx * 4 + 3] = 0.f;
        }
        if (sx == 0)
        {
            sx = 1;
            alpha[dx * 4 + 0] = alpha[dx * 4 + 0] + alpha[dx * 4 + 1];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 2];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 3];
            alpha[dx * 4 + 3] = 0.f;
        }
        if (sx == w - 2)
        {
            sx = w - 3;
            alpha[dx * 4 + 3] = alpha[dx * 4 + 2] + alpha[dx * 4 + 3];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 1];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 0];
            alpha[dx * 4 + 0] = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 3;
            alpha[dx * 4 + 3] = 1.f - alpha[dx * 4 + 0];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 0];
            alpha[dx * 4 + 1] = 0.f;
            alpha[dx * 4 + 0] = 0.f;
        }

        xofs[dx] = sx;
    }
}